

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * __thiscall
flatbuffers::Parser::TokenToStringId_abi_cxx11_(string *__return_storage_ptr__,Parser *this,int t)

{
  int t_local;
  Parser *this_local;
  
  if (t == 0x104) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(this->super_ParserState).attribute_);
  }
  else {
    (anonymous_namespace)::TokenToString_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)(uint)t,t);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::TokenToStringId(int t) const {
  return t == kTokenIdentifier ? attribute_ : TokenToString(t);
}